

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vectools.hpp
# Opt level: O3

void vectools::shuffle<Item*>(vector<Item_*,_std::allocator<Item_*>_> *vector,mt19937 *rng)

{
  pointer ppIVar1;
  ulong uVar2;
  result_type rVar3;
  Item **__src;
  Item **ppIVar4;
  Item **__args;
  vector<Item_*,_std::allocator<Item_*>_> elems;
  vector<Item_*,_std::allocator<Item_*>_> local_38;
  
  __args = (vector->super__Vector_base<Item_*,_std::allocator<Item_*>_>)._M_impl.
           super__Vector_impl_data._M_start;
  ppIVar4 = (vector->super__Vector_base<Item_*,_std::allocator<Item_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  if (__args != ppIVar4) {
    local_38.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_38.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_38.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    uVar2 = (long)ppIVar4 - (long)__args;
    while (8 < uVar2) {
      rVar3 = std::
              mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              ::operator()(rng);
      ppIVar1 = (vector->super__Vector_base<Item_*,_std::allocator<Item_*>_>)._M_impl.
                super__Vector_impl_data._M_start;
      uVar2 = (long)((double)((ulong)((long)(vector->
                                            super__Vector_base<Item_*,_std::allocator<Item_*>_>).
                                            _M_impl.super__Vector_impl_data._M_finish -
                                     (long)ppIVar1) >> 3 & 0xffffffff) *
                    (double)(rVar3 & 0xffffffff) * 2.3283064365386963e-10) & 0xffffffff;
      std::vector<Item*,std::allocator<Item*>>::emplace_back<Item*&>
                ((vector<Item*,std::allocator<Item*>> *)&local_38,ppIVar1 + uVar2);
      __args = (vector->super__Vector_base<Item_*,_std::allocator<Item_*>_>)._M_impl.
               super__Vector_impl_data._M_start;
      ppIVar4 = (vector->super__Vector_base<Item_*,_std::allocator<Item_*>_>)._M_impl.
                super__Vector_impl_data._M_finish;
      __src = __args + uVar2 + 1;
      if (__src != ppIVar4) {
        memmove(__args + uVar2,__src,(long)ppIVar4 - (long)__src);
        __args = (vector->super__Vector_base<Item_*,_std::allocator<Item_*>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        ppIVar4 = (vector->super__Vector_base<Item_*,_std::allocator<Item_*>_>)._M_impl.
                  super__Vector_impl_data._M_finish;
      }
      (vector->super__Vector_base<Item_*,_std::allocator<Item_*>_>)._M_impl.super__Vector_impl_data.
      _M_finish = ppIVar4 + -1;
      uVar2 = (long)(ppIVar4 + -1) - (long)__args;
    }
    std::vector<Item*,std::allocator<Item*>>::emplace_back<Item*&>
              ((vector<Item*,std::allocator<Item*>> *)&local_38,__args);
    std::vector<Item_*,_std::allocator<Item_*>_>::operator=(vector,&local_38);
    if (local_38.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_38.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_38.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_38.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

inline void shuffle(std::vector<T>& vector, std::mt19937& rng)
    {
        if (vector.empty())
            return;

        auto get_uniform_integer = [](uint32_t number, uint32_t range_low, uint32_t range_high) -> uint32_t
        {
            double proportion = static_cast<double>(number) / (1.0 + UINT32_MAX);
            uint32_t range = range_high - range_low + 1;
            return static_cast<uint32_t>(proportion * range) + range_low;
        };

        std::vector<T> elems;

        while (vector.size() > 1)
        {
            uint32_t random_pos = get_uniform_integer(rng(), 0, static_cast<uint32_t>(vector.size()-1));
            elems.emplace_back(vector[random_pos]);
            vector.erase(vector.begin() + random_pos);
        }

        elems.emplace_back(*vector.begin());
        vector = elems;
    }